

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

qsizetype bm_find(uchar *cc,qsizetype l,qsizetype index,uchar *puc,qsizetype pl,uchar *skiptable)

{
  long lVar1;
  qsizetype local_60;
  qsizetype skip;
  uchar *end;
  uchar *current;
  qsizetype pl_minus_one;
  uchar *skiptable_local;
  qsizetype pl_local;
  uchar *puc_local;
  qsizetype index_local;
  qsizetype l_local;
  uchar *cc_local;
  qsizetype local_8;
  
  if (pl == 0) {
    local_60 = index;
    if (l < index) {
      local_60 = -1;
    }
    local_8 = local_60;
  }
  else {
    lVar1 = pl + -1;
    for (current = cc + lVar1 + index; current < cc + l; current = current + skip) {
      skip = (qsizetype)skiptable[*current];
      if (skip == 0) {
        for (skip = 0; (skip < pl && (current[-skip] == puc[lVar1 - skip])); skip = skip + 1) {
        }
        if (lVar1 < skip) {
          return (qsizetype)(current + (-skip - (long)cc) + 1);
        }
        if ((ulong)skiptable[current[-skip]] == pl) {
          skip = pl - skip;
        }
        else {
          skip = 1;
        }
      }
      if (cc + l + -skip < current) break;
    }
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static inline qsizetype bm_find(const uchar *cc, qsizetype l, qsizetype index, const uchar *puc,
                                qsizetype pl, const uchar *skiptable)
{
    if (pl == 0)
        return index > l ? -1 : index;
    const qsizetype pl_minus_one = pl - 1;

    const uchar *current = cc + index + pl_minus_one;
    const uchar *end = cc + l;
    while (current < end) {
        qsizetype skip = skiptable[*current];
        if (!skip) {
            // possible match
            while (skip < pl) {
                if (*(current - skip) != puc[pl_minus_one - skip])
                    break;
                skip++;
            }
            if (skip > pl_minus_one) // we have a match
                return (current - cc) - skip + 1;

            // in case we don't have a match we are a bit inefficient as we only skip by one
            // when we have the non matching char in the string.
            if (skiptable[*(current - skip)] == pl)
                skip = pl - skip;
            else
                skip = 1;
        }
        if (current > end - skip)
            break;
        current += skip;
    }
    return -1; // not found
}